

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

void cfd::core::MergePsbtInputs(wally_psbt *psbt,wally_psbt *psbt_dest,bool ignore_duplicate_error)

{
  size_type *psVar1;
  pointer puVar2;
  uint uVar3;
  unsigned_long uVar4;
  ulong uVar5;
  bool bVar6;
  char cVar7;
  char cVar8;
  undefined8 *puVar9;
  CfdException *pCVar10;
  uint uVar11;
  size_t sVar12;
  undefined7 in_register_00000011;
  wally_tx_input *pwVar13;
  long lVar14;
  undefined8 uVar15;
  pointer puVar16;
  wally_tx_input *pwVar17;
  unsigned_long *puVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string item_key;
  string __str_1;
  Txid txid;
  int ret;
  vector<unsigned_long,_std::allocator<unsigned_long>_> append_indexes;
  undefined1 local_120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  string local_100;
  wally_psbt *local_e0;
  pointer *local_d8;
  uint local_d0;
  undefined4 uStack_cc;
  pointer local_c8 [2];
  wally_psbt *local_b8;
  undefined4 local_ac;
  unsigned_long local_a8;
  undefined1 local_a0 [16];
  _func_int *local_90 [2];
  int local_7c;
  string local_78;
  unsigned_long *local_58;
  iterator iStack_50;
  unsigned_long *local_48;
  unsigned_long *local_38;
  
  local_48 = (unsigned_long *)0x0;
  local_58 = (unsigned_long *)0x0;
  iStack_50._M_current = (unsigned_long *)0x0;
  local_a8 = 0;
  if (psbt_dest->num_inputs == 0) {
    return;
  }
  local_ac = (undefined4)CONCAT71(in_register_00000011,ignore_duplicate_error);
  local_e0 = psbt_dest;
  local_b8 = psbt;
LAB_0043faa7:
  sVar12 = local_b8->num_inputs;
  if (sVar12 != 0) {
    pwVar17 = local_e0->tx->inputs + local_a8;
    pwVar13 = local_b8->tx->inputs;
    lVar14 = 0;
    do {
      if ((pwVar13->index == pwVar17->index) &&
         (auVar20[0] = -(pwVar17->txhash[0] == pwVar13->txhash[0]),
         auVar20[1] = -(pwVar17->txhash[1] == pwVar13->txhash[1]),
         auVar20[2] = -(pwVar17->txhash[2] == pwVar13->txhash[2]),
         auVar20[3] = -(pwVar17->txhash[3] == pwVar13->txhash[3]),
         auVar20[4] = -(pwVar17->txhash[4] == pwVar13->txhash[4]),
         auVar20[5] = -(pwVar17->txhash[5] == pwVar13->txhash[5]),
         auVar20[6] = -(pwVar17->txhash[6] == pwVar13->txhash[6]),
         auVar20[7] = -(pwVar17->txhash[7] == pwVar13->txhash[7]),
         auVar20[8] = -(pwVar17->txhash[8] == pwVar13->txhash[8]),
         auVar20[9] = -(pwVar17->txhash[9] == pwVar13->txhash[9]),
         auVar20[10] = -(pwVar17->txhash[10] == pwVar13->txhash[10]),
         auVar20[0xb] = -(pwVar17->txhash[0xb] == pwVar13->txhash[0xb]),
         auVar20[0xc] = -(pwVar17->txhash[0xc] == pwVar13->txhash[0xc]),
         auVar20[0xd] = -(pwVar17->txhash[0xd] == pwVar13->txhash[0xd]),
         auVar20[0xe] = -(pwVar17->txhash[0xe] == pwVar13->txhash[0xe]),
         auVar20[0xf] = -(pwVar17->txhash[0xf] == pwVar13->txhash[0xf]),
         auVar19[0] = -(pwVar17->txhash[0x10] == pwVar13->txhash[0x10]),
         auVar19[1] = -(pwVar17->txhash[0x11] == pwVar13->txhash[0x11]),
         auVar19[2] = -(pwVar17->txhash[0x12] == pwVar13->txhash[0x12]),
         auVar19[3] = -(pwVar17->txhash[0x13] == pwVar13->txhash[0x13]),
         auVar19[4] = -(pwVar17->txhash[0x14] == pwVar13->txhash[0x14]),
         auVar19[5] = -(pwVar17->txhash[0x15] == pwVar13->txhash[0x15]),
         auVar19[6] = -(pwVar17->txhash[0x16] == pwVar13->txhash[0x16]),
         auVar19[7] = -(pwVar17->txhash[0x17] == pwVar13->txhash[0x17]),
         auVar19[8] = -(pwVar17->txhash[0x18] == pwVar13->txhash[0x18]),
         auVar19[9] = -(pwVar17->txhash[0x19] == pwVar13->txhash[0x19]),
         auVar19[10] = -(pwVar17->txhash[0x1a] == pwVar13->txhash[0x1a]),
         auVar19[0xb] = -(pwVar17->txhash[0x1b] == pwVar13->txhash[0x1b]),
         auVar19[0xc] = -(pwVar17->txhash[0x1c] == pwVar13->txhash[0x1c]),
         auVar19[0xd] = -(pwVar17->txhash[0x1d] == pwVar13->txhash[0x1d]),
         auVar19[0xe] = -(pwVar17->txhash[0x1e] == pwVar13->txhash[0x1e]),
         auVar19[0xf] = -(pwVar17->txhash[0x1f] == pwVar13->txhash[0x1f]),
         auVar19 = auVar19 & auVar20,
         (ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff)) {
        ByteData::ByteData((ByteData *)local_120,pwVar13->txhash,0x20);
        ByteData256::ByteData256((ByteData256 *)&local_100,(ByteData *)local_120);
        Txid::Txid((Txid *)local_a0,(ByteData256 *)&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_100._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_120._0_8_);
        }
        Txid::GetHex_abi_cxx11_(&local_78,(Txid *)local_a0);
        local_120._0_8_ = &local_110;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_120,local_78._M_dataplus._M_p,
                   local_78._M_dataplus._M_p + local_78._M_string_length);
        ::std::__cxx11::string::append((char *)local_120);
        uVar3 = pwVar13->index;
        cVar8 = '\x01';
        if (uVar3 < 10) goto LAB_0043fc4c;
        uVar11 = uVar3;
        cVar7 = '\x04';
        goto LAB_0043fc0f;
      }
      lVar14 = lVar14 + -0x110;
      pwVar13 = pwVar13 + 1;
      sVar12 = sVar12 - 1;
    } while (sVar12 != 0);
  }
  if (iStack_50._M_current == local_48) {
    ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_58,iStack_50,&local_a8)
    ;
  }
  else {
    *iStack_50._M_current = local_a8;
    iStack_50._M_current = iStack_50._M_current + 1;
  }
  goto LAB_0043fddf;
  while( true ) {
    if (uVar11 < 10000) goto LAB_0043fc4c;
    bVar6 = uVar11 < 100000;
    uVar11 = uVar11 / 10000;
    cVar7 = cVar8 + '\x04';
    if (bVar6) break;
LAB_0043fc0f:
    cVar8 = cVar7;
    if (uVar11 < 100) {
      cVar8 = cVar8 + -2;
      goto LAB_0043fc4c;
    }
    if (uVar11 < 1000) {
      cVar8 = cVar8 + -1;
      goto LAB_0043fc4c;
    }
  }
  cVar8 = cVar8 + '\x01';
LAB_0043fc4c:
  local_d8 = local_c8;
  ::std::__cxx11::string::_M_construct((ulong)&local_d8,cVar8);
  ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_d8,local_d0,uVar3);
  uVar15 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._0_8_ != &local_110) {
    uVar15 = local_110._M_allocated_capacity;
  }
  puVar2 = (pointer)(CONCAT44(uStack_cc,local_d0) + CONCAT44(local_120._12_4_,local_120._8_4_));
  if ((ulong)uVar15 < puVar2) {
    puVar16 = (pointer)0xf;
    if (local_d8 != local_c8) {
      puVar16 = local_c8[0];
    }
    if (puVar2 <= puVar16) {
      puVar9 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,local_120._0_8_);
      goto LAB_0043fcde;
    }
  }
  puVar9 = (undefined8 *)::std::__cxx11::string::_M_append(local_120,(ulong)local_d8);
LAB_0043fcde:
  psVar1 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_100.field_2._M_allocated_capacity = *psVar1;
    local_100.field_2._8_8_ = puVar9[3];
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  }
  else {
    local_100.field_2._M_allocated_capacity = *psVar1;
    local_100._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_100._M_string_length = puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._0_8_ != &local_110) {
    operator_delete((void *)local_120._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (pwVar13->sequence != pwVar17->sequence && SUB41(local_ac,0) == false) {
    local_120._0_8_ = "cfdcore_psbt.cpp";
    local_120._8_4_ = 0x26b;
    local_110._M_allocated_capacity = 0x58698c;
    logger::log<std::__cxx11::string&>
              ((CfdSourceLocation *)local_120,kCfdLogLevelWarning,"psbt sequence duplicate. [{}]",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100);
    pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
    local_120._0_8_ = &local_110;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_120,"psbt sequence duplicate error.","");
    CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,(string *)local_120);
    __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
  }
  MergePsbtInputItem((wally_psbt_input *)((long)local_b8->inputs - lVar14),
                     local_e0->inputs + local_a8,SUB41(local_ac,0),&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  local_a0._0_8_ = &PTR__Txid_00678d28;
  if ((void *)CONCAT44(local_a0._12_4_,local_a0._8_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_a0._12_4_,local_a0._8_4_));
  }
LAB_0043fddf:
  local_a8 = local_a8 + 1;
  if (local_e0->num_inputs <= local_a8) goto code_r0x0043fe01;
  goto LAB_0043faa7;
code_r0x0043fe01:
  local_38 = iStack_50._M_current;
  puVar18 = local_58;
  if (local_58 != iStack_50._M_current) {
    do {
      uVar4 = *puVar18;
      uVar5 = local_b8->num_inputs;
      local_7c = wally_psbt_add_input_at(local_b8,(uint32_t)uVar5,1,local_e0->tx->inputs + uVar4);
      if (local_7c != 0) {
        local_a0._0_8_ = "cfdcore_psbt.cpp";
        local_a0._8_4_ = 0x27f;
        local_90[0] = (_func_int *)0x58698c;
        logger::log<int&>((CfdSourceLocation *)local_a0,kCfdLogLevelWarning,
                          "wally_psbt_add_input_at NG[{}]",&local_7c);
        pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
        local_a0._0_8_ = local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a0,"psbt add global unkonwns error.","");
        CfdException::CfdException(pCVar10,kCfdMemoryFullError,(string *)local_a0);
        __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
      }
      pwVar13 = local_e0->tx->inputs + uVar4;
      ByteData::ByteData((ByteData *)local_120,pwVar13->txhash,0x20);
      ByteData256::ByteData256((ByteData256 *)&local_100,(ByteData *)local_120);
      Txid::Txid((Txid *)local_a0,(ByteData256 *)&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_120._0_8_);
      }
      Txid::GetHex_abi_cxx11_(&local_78,(Txid *)local_a0);
      local_120._0_8_ = &local_110;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_120,local_78._M_dataplus._M_p,
                 local_78._M_dataplus._M_p + local_78._M_string_length);
      ::std::__cxx11::string::append((char *)local_120);
      uVar3 = pwVar13->index;
      cVar8 = '\x01';
      if (9 < uVar3) {
        uVar11 = uVar3;
        cVar7 = '\x04';
        do {
          cVar8 = cVar7;
          if (uVar11 < 100) {
            cVar8 = cVar8 + -2;
            goto LAB_0043ff60;
          }
          if (uVar11 < 1000) {
            cVar8 = cVar8 + -1;
            goto LAB_0043ff60;
          }
          if (uVar11 < 10000) goto LAB_0043ff60;
          bVar6 = 99999 < uVar11;
          uVar11 = uVar11 / 10000;
          cVar7 = cVar8 + '\x04';
        } while (bVar6);
        cVar8 = cVar8 + '\x01';
      }
LAB_0043ff60:
      local_d8 = local_c8;
      ::std::__cxx11::string::_M_construct((ulong)&local_d8,cVar8);
      ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_d8,local_d0,uVar3);
      uVar15 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._0_8_ != &local_110) {
        uVar15 = local_110._M_allocated_capacity;
      }
      puVar2 = (pointer)(CONCAT44(uStack_cc,local_d0) + CONCAT44(local_120._12_4_,local_120._8_4_));
      if ((ulong)uVar15 < puVar2) {
        puVar16 = (pointer)0xf;
        if (local_d8 != local_c8) {
          puVar16 = local_c8[0];
        }
        if (puVar16 < puVar2) goto LAB_0043ffd2;
        puVar9 = (undefined8 *)
                 ::std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,local_120._0_8_);
      }
      else {
LAB_0043ffd2:
        puVar9 = (undefined8 *)::std::__cxx11::string::_M_append(local_120,(ulong)local_d8);
      }
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      psVar1 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_100.field_2._M_allocated_capacity = *psVar1;
        local_100.field_2._8_8_ = puVar9[3];
      }
      else {
        local_100.field_2._M_allocated_capacity = *psVar1;
        local_100._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_100._M_string_length = puVar9[1];
      *puVar9 = psVar1;
      puVar9[1] = 0;
      *(undefined1 *)psVar1 = 0;
      if (local_d8 != local_c8) {
        operator_delete(local_d8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._0_8_ != &local_110) {
        operator_delete((void *)local_120._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      MergePsbtInputItem(local_b8->inputs + (uVar5 & 0xffffffff),local_e0->inputs + uVar4,
                         local_ac._0_1_,&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      local_a0._0_8_ = &PTR__Txid_00678d28;
      if ((void *)CONCAT44(local_a0._12_4_,local_a0._8_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_a0._12_4_,local_a0._8_4_));
      }
      puVar18 = puVar18 + 1;
    } while (puVar18 != local_38);
  }
  if (local_58 != (unsigned_long *)0x0) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void MergePsbtInputs(
    struct wally_psbt *psbt, const struct wally_psbt *psbt_dest,
    bool ignore_duplicate_error) {
  bool is_find;
  int ret;
  std::vector<size_t> append_indexes;
  for (size_t dst_idx = 0; dst_idx < psbt_dest->num_inputs; ++dst_idx) {
    auto dest_txin = &psbt_dest->tx->inputs[dst_idx];
    is_find = false;
    for (size_t src_idx = 0; src_idx < psbt->num_inputs; ++src_idx) {
      auto src_txin = &psbt->tx->inputs[src_idx];
      if ((src_txin->index == dest_txin->index) &&
          (memcmp(
               src_txin->txhash, dest_txin->txhash,
               sizeof(src_txin->txhash)) == 0)) {
        is_find = true;
        Txid txid(ByteData256(ByteData(
            src_txin->txhash,
            static_cast<uint32_t>(sizeof(src_txin->txhash)))));
        std::string item_key =
            txid.GetHex() + "," + std::to_string(src_txin->index);
        if (src_txin->sequence == dest_txin->sequence) {
          // do nothing
        } else if (ignore_duplicate_error) {
          // do nothing
        } else {
          warn(CFD_LOG_SOURCE, "psbt sequence duplicate. [{}]", item_key);
          throw CfdException(
              kCfdIllegalArgumentError, "psbt sequence duplicate error.");
        }
        MergePsbtInputItem(
            &psbt->inputs[src_idx], &psbt_dest->inputs[dst_idx],
            ignore_duplicate_error, item_key);
        break;
      }
    }
    if (!is_find) append_indexes.push_back(dst_idx);
  }

  uint32_t index;
  for (auto dst_idx : append_indexes) {
    index = static_cast<uint32_t>(psbt->num_inputs);
    ret = wally_psbt_add_input_at(
        psbt, index, WALLY_PSBT_FLAG_NON_FINAL,
        &psbt_dest->tx->inputs[dst_idx]);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_add_input_at NG[{}]", ret);
      throw CfdException(
          kCfdMemoryFullError, "psbt add global unkonwns error.");
    }
    auto dest_txin = &psbt_dest->tx->inputs[dst_idx];
    Txid txid(ByteData256(ByteData(
        dest_txin->txhash, static_cast<uint32_t>(sizeof(dest_txin->txhash)))));
    std::string item_key =
        txid.GetHex() + "," + std::to_string(dest_txin->index);
    MergePsbtInputItem(
        &psbt->inputs[index], &psbt_dest->inputs[dst_idx],
        ignore_duplicate_error, item_key);
  }
}